

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void GEO::parallel(function<void_()> *f1,function<void_()> *f2)

{
  int *piVar1;
  Thread *pTVar2;
  ThreadManager *pTVar3;
  ThreadGroup threads;
  SmartPointer<GEO::Thread> local_80;
  vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_> local_78;
  _Any_data local_60;
  code *local_50;
  _Any_data local_40;
  code *local_30;
  
  if (::(anonymous_namespace)::running_threads_invocations_ < 1) {
    local_78.
    super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar2 = (Thread *)operator_new(0x30);
    std::function<void_()>::function((function<void_()> *)&local_40,f1);
    *(undefined8 *)&(pTVar2->super_Counted).nb_refs_ = 0;
    (pTVar2->super_Counted)._vptr_Counted = (_func_int **)&PTR__ParallelThread_001a96b8;
    std::function<void_()>::function
              ((function<void_()> *)(pTVar2 + 1),(function<void_()> *)&local_40);
    piVar1 = &(pTVar2->super_Counted).nb_refs_;
    *piVar1 = *piVar1 + 1;
    local_80.pointer_ = pTVar2;
    std::vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>::
    emplace_back<GEO::SmartPointer<GEO::Thread>>
              ((vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
                *)&local_78,&local_80);
    if (local_80.pointer_ != (Thread *)0x0) {
      piVar1 = &((local_80.pointer_)->super_Counted).nb_refs_;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*((local_80.pointer_)->super_Counted)._vptr_Counted[1])();
      }
    }
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,__destroy_functor);
    }
    pTVar2 = (Thread *)operator_new(0x30);
    std::function<void_()>::function((function<void_()> *)&local_60,f2);
    *(undefined8 *)&(pTVar2->super_Counted).nb_refs_ = 0;
    (pTVar2->super_Counted)._vptr_Counted = (_func_int **)&PTR__ParallelThread_001a96b8;
    std::function<void_()>::function
              ((function<void_()> *)(pTVar2 + 1),(function<void_()> *)&local_60);
    piVar1 = &(pTVar2->super_Counted).nb_refs_;
    *piVar1 = *piVar1 + 1;
    local_80.pointer_ = pTVar2;
    std::vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>::
    emplace_back<GEO::SmartPointer<GEO::Thread>>
              ((vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
                *)&local_78,&local_80);
    if (local_80.pointer_ != (Thread *)0x0) {
      piVar1 = &((local_80.pointer_)->super_Counted).nb_refs_;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*((local_80.pointer_)->super_Counted)._vptr_Counted[1])();
      }
    }
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
    ::(anonymous_namespace)::running_threads_invocations_ =
         ::(anonymous_namespace)::running_threads_invocations_ + 1;
    pTVar3 = SmartPointer<GEO::ThreadManager>::operator->
                       ((SmartPointer<GEO::ThreadManager> *)
                        &::(anonymous_namespace)::thread_manager_);
    (*(pTVar3->super_Counted)._vptr_Counted[2])(pTVar3,&local_78);
    ::(anonymous_namespace)::running_threads_invocations_ =
         ::(anonymous_namespace)::running_threads_invocations_ + -1;
    std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
    ~vector(&local_78);
    return;
  }
  if ((f1->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*f1->_M_invoker)((_Any_data *)f1);
    if ((f2->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*f2->_M_invoker)((_Any_data *)f2);
      return;
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

void parallel(
	std::function<void()> f1,
	std::function<void()> f2
    ) {
        if(Process::is_running_threads()) {
	    f1();
	    f2();
        } else {
            ThreadGroup threads;
	    threads.push_back(new ParallelThread(f1));
	    threads.push_back(new ParallelThread(f2));
            Process::run_threads(threads);
        }
    }